

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

int test_socket_impl(char *file,int line,int family,int protocol)

{
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  
  iVar1 = nn_socket(1,0x70,CONCAT44(in_register_00000014,family),
                    CONCAT44(in_register_0000000c,protocol));
  __stream = _stderr;
  if (iVar1 != -1) {
    return iVar1;
  }
  puVar2 = (uint *)__errno_location();
  pcVar3 = nn_err_strerror(*puVar2);
  fprintf(__stream,"Failed create socket: %s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/bus.c",
          (ulong)file & 0xffffffff);
  nn_err_abort();
}

Assistant:

static int NN_UNUSED test_socket_impl (char *file, int line, int family,
    int protocol)
{
    int sock;

    sock = nn_socket (family, protocol);
    if (sock == -1) {
        fprintf (stderr, "Failed create socket: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }

    return sock;
}